

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall p2t::SweepContext::InitTriangulation(SweepContext *this)

{
  value_type pPVar1;
  reference ppPVar2;
  size_type sVar3;
  Point *pPVar4;
  iterator __first;
  iterator __last;
  double dVar5;
  double dVar6;
  double dy;
  double dx;
  Point *p;
  double dStack_30;
  uint i;
  double ymin;
  double ymax;
  double xmin;
  double xmax;
  SweepContext *this_local;
  
  ppPVar2 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[](&this->points_,0);
  xmin = (*ppPVar2)->x;
  ppPVar2 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[](&this->points_,0);
  ymax = (*ppPVar2)->x;
  ppPVar2 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[](&this->points_,0);
  ymin = (*ppPVar2)->y;
  ppPVar2 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[](&this->points_,0);
  dStack_30 = (*ppPVar2)->y;
  p._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::size(&this->points_);
    if (sVar3 <= p._4_4_) break;
    ppPVar2 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[]
                        (&this->points_,(ulong)p._4_4_);
    pPVar1 = *ppPVar2;
    if (xmin < pPVar1->x) {
      xmin = pPVar1->x;
    }
    if (pPVar1->x < ymax) {
      ymax = pPVar1->x;
    }
    if (ymin < pPVar1->y) {
      ymin = pPVar1->y;
    }
    if (pPVar1->y < dStack_30) {
      dStack_30 = pPVar1->y;
    }
    p._4_4_ = p._4_4_ + 1;
  }
  dVar5 = (xmin - ymax) * 0.3;
  dVar6 = (ymin - dStack_30) * 0.3;
  pPVar4 = (Point *)operator_new(0x28);
  Point::Point(pPVar4,xmin + dVar5,dStack_30 - dVar6);
  this->head_ = pPVar4;
  pPVar4 = (Point *)operator_new(0x28);
  Point::Point(pPVar4,ymax - dVar5,dStack_30 - dVar6);
  this->tail_ = pPVar4;
  __first = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::begin(&this->points_);
  __last = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::end(&this->points_);
  std::
  sort<__gnu_cxx::__normal_iterator<p2t::Point**,std::vector<p2t::Point*,std::allocator<p2t::Point*>>>,bool(*)(p2t::Point_const*,p2t::Point_const*)>
            ((__normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>
              )__first._M_current,
             (__normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>
              )__last._M_current,cmp);
  return;
}

Assistant:

void SweepContext::InitTriangulation()
{
  double xmax(points_[0]->x), xmin(points_[0]->x);
  double ymax(points_[0]->y), ymin(points_[0]->y);

  // Calculate bounds.
  for (unsigned int i = 0; i < points_.size(); i++) {
    Point& p = *points_[i];
    if (p.x > xmax)
      xmax = p.x;
    if (p.x < xmin)
      xmin = p.x;
    if (p.y > ymax)
      ymax = p.y;
    if (p.y < ymin)
      ymin = p.y;
  }

  double dx = kAlpha * (xmax - xmin);
  double dy = kAlpha * (ymax - ymin);
  head_ = new Point(xmax + dx, ymin - dy);
  tail_ = new Point(xmin - dx, ymin - dy);

  // Sort points along y-axis
  std::sort(points_.begin(), points_.end(), cmp);

}